

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

wchar_t archive_mstring_copy_mbs(archive_mstring *aes,char *mbs)

{
  size_t n;
  
  if (mbs == (char *)0x0) {
    aes->aes_set = L'\0';
  }
  else {
    n = strlen(mbs);
    aes->aes_set = L'\x01';
    (aes->aes_mbs).length = 0;
    archive_strncat(&aes->aes_mbs,mbs,n);
    (aes->aes_utf8).length = 0;
    (aes->aes_wcs).length = 0;
  }
  return L'\0';
}

Assistant:

int
archive_mstring_copy_mbs(struct archive_mstring *aes, const char *mbs)
{
	if (mbs == NULL) {
		aes->aes_set = 0;
		return (0);
	}
	return (archive_mstring_copy_mbs_len(aes, mbs, strlen(mbs)));
}